

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::make
          (GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *this,string *name)

{
  Buffer *this_00;
  mapped_type *this_01;
  SharedPtr<deqp::gls::LongStressCaseInternal::Buffer> SStack_28;
  
  this_00 = (Buffer *)operator_new(8);
  Buffer::Buffer(this_00);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>::SharedPtr(&SStack_28,this_00);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
            ::operator[](&this->m_objects,name);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>::operator=(this_01,&SStack_28);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>::release(&SStack_28);
  return;
}

Assistant:

void						make						(const string& name)								{ DE_ASSERT(!has(name)); m_objects[name] = SharedPtr<T>(new T); }